

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O2

void __thiscall Imath_3_2::Euler<float>::extract(Euler<float> *this,Matrix33<float> *M)

{
  float fVar1;
  byte bVar2;
  long lVar3;
  float (*pafVar4) [4];
  float fVar5;
  int i;
  int k;
  int j;
  int local_104;
  int local_100;
  int local_fc;
  Vec3<float> local_f8;
  Matrix44<float> local_e8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  float afStack_90 [2];
  float local_88 [10];
  Matrix44<float> local_60;
  
  angleOrder(this,&local_104,&local_fc,&local_100);
  if ((this->field_0xc & 2) == 0) {
    fVar5 = atan2f(M->x[local_fc][local_100],*(float *)((long)M->x + (long)local_100 * 0x10));
    (this->super_Vec3<float>).x = fVar5;
    local_f8.x = 0.0;
    local_f8.y = 0.0;
    local_f8.z = 0.0;
    if ((this->field_0xc & 4) != 0) {
      fVar5 = -fVar5;
    }
    (&local_f8.x)[local_104] = fVar5;
    local_e8.x[0][0] = 1.0;
    local_e8.x[0][1] = 0.0;
    local_e8.x[0][2] = 0.0;
    local_e8.x[0][3] = 0.0;
    local_e8.x[1][0] = 0.0;
    local_e8.x[1][1] = 1.0;
    local_e8.x[1][2] = 0.0;
    local_e8.x[1][3] = 0.0;
    local_e8.x[2][0] = 0.0;
    local_e8.x[2][1] = 0.0;
    local_e8.x[2][2] = 1.0;
    local_e8.x[2][3] = 0.0;
    local_e8.x[3][0] = 0.0;
    local_e8.x[3][1] = 0.0;
    local_e8.x[3][2] = 0.0;
    local_e8.x[3][3] = 1.0;
    Matrix44<float>::rotate<float>(&local_e8,&local_f8);
    local_60.x[0][2] = M->x[0][2];
    local_60.x[1][2] = M->x[1][2];
    local_60.x[2][2] = M->x[2][2];
    local_60.x[0]._0_8_ = *(undefined8 *)M->x[0];
    local_60.x[0][3] = 0.0;
    local_60.x[1]._0_8_ = *(undefined8 *)M->x[1];
    local_60.x[1][3] = 0.0;
    local_60.x[2]._0_8_ = *(undefined8 *)M->x[2];
    local_60.x[2][3] = 0.0;
    local_60.x[3][0] = 0.0;
    local_60.x[3][1] = 0.0;
    local_60.x[3][2] = 0.0;
    local_60.x[3][3] = 1.0;
    Matrix44<float>::multiply(&local_e8,&local_60);
    local_e8.x[0][0] = (float)local_a8;
    local_e8.x[0][1] = (float)((ulong)local_a8 >> 0x20);
    local_e8.x[0][2] = (float)uStack_a0;
    local_e8.x[0][3] = (float)((ulong)uStack_a0 >> 0x20);
    local_e8.x[1][0] = (float)local_98;
    local_e8.x[1][1] = (float)((ulong)local_98 >> 0x20);
    local_e8.x[1][2] = afStack_90[0];
    local_e8.x[1][3] = afStack_90[1];
    local_e8.x[2][0] = local_88[0];
    local_e8.x[2][1] = local_88[1];
    local_e8.x[2][2] = (float)local_88._8_8_;
    local_e8.x[2][3] = SUB84(local_88._8_8_,4);
    local_e8.x[3][0] = (float)local_88._16_8_;
    local_e8.x[3][1] = SUB84(local_88._16_8_,4);
    local_e8.x[3][2] = (float)local_88._24_8_;
    local_e8.x[3][3] = SUB84(local_88._24_8_,4);
    lVar3 = (long)local_104;
    fVar5 = *(float *)((long)local_e8.x + lVar3 * 0x14);
    fVar1 = local_e8.x[lVar3][local_fc];
    fVar5 = atan2f(-local_e8.x[lVar3][local_100],SQRT(fVar5 * fVar5 + fVar1 * fVar1));
    (this->super_Vec3<float>).y = fVar5;
    lVar3 = (long)local_fc;
    pafVar4 = local_e8.x + lVar3;
    fVar5 = -(*pafVar4)[local_104];
  }
  else {
    fVar5 = atan2f(M->x[local_fc][local_104],M->x[local_100][local_104]);
    (this->super_Vec3<float>).x = fVar5;
    local_f8.x = 0.0;
    local_f8.y = 0.0;
    local_f8.z = 0.0;
    if ((this->field_0xc & 4) != 0) {
      fVar5 = -fVar5;
    }
    (&local_f8.x)[local_104] = fVar5;
    local_e8.x[0][0] = 1.0;
    local_e8.x[0][1] = 0.0;
    local_e8.x[0][2] = 0.0;
    local_e8.x[0][3] = 0.0;
    local_e8.x[1][0] = 0.0;
    local_e8.x[1][1] = 1.0;
    local_e8.x[1][2] = 0.0;
    local_e8.x[1][3] = 0.0;
    local_e8.x[2][0] = 0.0;
    local_e8.x[2][1] = 0.0;
    local_e8.x[2][2] = 1.0;
    local_e8.x[2][3] = 0.0;
    local_e8.x[3][0] = 0.0;
    local_e8.x[3][1] = 0.0;
    local_e8.x[3][2] = 0.0;
    local_e8.x[3][3] = 1.0;
    Matrix44<float>::rotate<float>(&local_e8,&local_f8);
    local_60.x[0][2] = M->x[0][2];
    local_60.x[1][2] = M->x[1][2];
    local_60.x[2][2] = M->x[2][2];
    local_60.x[0]._0_8_ = *(undefined8 *)M->x[0];
    local_60.x[0][3] = 0.0;
    local_60.x[1]._0_8_ = *(undefined8 *)M->x[1];
    local_60.x[1][3] = 0.0;
    local_60.x[2]._0_8_ = *(undefined8 *)M->x[2];
    local_60.x[2][3] = 0.0;
    local_60.x[3][0] = 0.0;
    local_60.x[3][1] = 0.0;
    local_60.x[3][2] = 0.0;
    local_60.x[3][3] = 1.0;
    Matrix44<float>::multiply(&local_e8,&local_60);
    local_e8.x[0][0] = (float)local_a8;
    local_e8.x[0][1] = (float)((ulong)local_a8 >> 0x20);
    local_e8.x[0][2] = (float)uStack_a0;
    local_e8.x[0][3] = (float)((ulong)uStack_a0 >> 0x20);
    local_e8.x[1][0] = (float)local_98;
    local_e8.x[1][1] = (float)((ulong)local_98 >> 0x20);
    local_e8.x[1][2] = afStack_90[0];
    local_e8.x[1][3] = afStack_90[1];
    local_e8.x[2][0] = local_88[0];
    local_e8.x[2][1] = local_88[1];
    local_e8.x[2][2] = (float)local_88._8_8_;
    local_e8.x[2][3] = SUB84(local_88._8_8_,4);
    local_e8.x[3][0] = (float)local_88._16_8_;
    local_e8.x[3][1] = SUB84(local_88._16_8_,4);
    local_e8.x[3][2] = (float)local_88._24_8_;
    local_e8.x[3][3] = SUB84(local_88._24_8_,4);
    lVar3 = (long)local_104;
    fVar5 = local_e8.x[local_fc][lVar3];
    fVar1 = local_e8.x[local_100][lVar3];
    fVar5 = atan2f(SQRT(fVar5 * fVar5 + fVar1 * fVar1),*(float *)((long)local_e8.x + lVar3 * 0x14));
    (this->super_Vec3<float>).y = fVar5;
    lVar3 = (long)local_fc;
    pafVar4 = local_e8.x + lVar3;
    fVar5 = (*pafVar4)[local_100];
  }
  fVar5 = atan2f(fVar5,(*pafVar4)[lVar3]);
  (this->super_Vec3<float>).z = fVar5;
  bVar2 = this->field_0xc;
  if ((bVar2 & 4) == 0) {
    Vec3<float>::operator*=(&this->super_Vec3<float>,-1.0);
    bVar2 = this->field_0xc;
  }
  if ((bVar2 & 1) == 0) {
    fVar5 = (this->super_Vec3<float>).x;
    (this->super_Vec3<float>).x = (this->super_Vec3<float>).z;
    (this->super_Vec3<float>).z = fVar5;
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE void
Euler<T>::extract (const Matrix33<T>& M) IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    if (_initialRepeated)
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][i], M[k][i]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);

        N = N * Matrix44<T> (
                    M[0][0],
                    M[0][1],
                    M[0][2],
                    0,
                    M[1][0],
                    M[1][1],
                    M[1][2],
                    0,
                    M[2][0],
                    M[2][1],
                    M[2][2],
                    0,
                    0,
                    0,
                    0,
                    1);
        //
        // Extract the other two angles, y and z, from N.
        //

        T sy = std::sqrt (N[j][i] * N[j][i] + N[k][i] * N[k][i]);
        y    = std::atan2 (sy, N[i][i]);
        z    = std::atan2 (N[j][k], N[j][j]);
    }
    else
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][k], M[k][k]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);

        N = N * Matrix44<T> (
                    M[0][0],
                    M[0][1],
                    M[0][2],
                    0,
                    M[1][0],
                    M[1][1],
                    M[1][2],
                    0,
                    M[2][0],
                    M[2][1],
                    M[2][2],
                    0,
                    0,
                    0,
                    0,
                    1);
        //
        // Extract the other two angles, y and z, from N.
        //

        T cy = std::sqrt (N[i][i] * N[i][i] + N[i][j] * N[i][j]);
        y    = std::atan2 (-N[i][k], cy);
        z    = std::atan2 (-N[j][i], N[j][j]);
    }

    if (!_parityEven) *this *= -1;

    if (!_frameStatic)
    {
        T t = x;
        x   = z;
        z   = t;
    }
}